

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_info.cpp
# Opt level: O2

string * __thiscall
duckdb::CreateTableInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,CreateTableInfo *this)

{
  pointer pSVar1;
  string *name;
  ColumnList *columns;
  allocator local_59;
  string local_58;
  string local_38;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_58);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_CreateInfo).on_conflict == REPLACE_ON_CONFLICT) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->super_CreateInfo).temporary == true) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_CreateInfo).on_conflict == IGNORE_ON_CONFLICT) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->super_CreateInfo).temporary == true) {
    ::std::__cxx11::string::string((string *)&local_38,anon_var_dwarf_3b2a81b + 9,&local_59);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_38,(string *)&(this->super_CreateInfo).catalog);
  }
  name = &this->table;
  ParseInfo::QualifierToString(&local_58,&local_38,&(this->super_CreateInfo).schema,name);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  if ((this->query).
      super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
      .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl ==
      (SelectStatement *)0x0) {
    TableCatalogEntry::ColumnsToSQL_abi_cxx11_
              (&local_38,(TableCatalogEntry *)&this->columns,(ColumnList *)&this->constraints,
               (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                *)name);
    ::std::operator+(&local_58,&local_38,";");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    TableCatalogEntry::ColumnNamesToSQL_abi_cxx11_
              (&local_58,(TableCatalogEntry *)&this->columns,columns);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_58);
    pSVar1 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->query);
    (*(pSVar1->super_SQLStatement)._vptr_SQLStatement[2])(&local_38,pSVar1);
    ::std::operator+(&local_58," AS ",&local_38);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CreateTableInfo::ToString() const {
	string ret = "";

	ret += "CREATE";
	if (on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT) {
		ret += " OR REPLACE";
	}
	if (temporary) {
		ret += " TEMP";
	}
	ret += " TABLE ";

	if (on_conflict == OnCreateConflict::IGNORE_ON_CONFLICT) {
		ret += " IF NOT EXISTS ";
	}
	ret += QualifierToString(temporary ? "" : catalog, schema, table);

	if (query != nullptr) {
		ret += TableCatalogEntry::ColumnNamesToSQL(columns);
		ret += " AS " + query->ToString();
	} else {
		ret += TableCatalogEntry::ColumnsToSQL(columns, constraints) + ";";
	}
	return ret;
}